

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void insertElement(Hash *pH,_ht *pEntry,HashElem *pNew)

{
  HashElem *pHVar1;
  HashElem *pHVar2;
  HashElem **ppHVar3;
  
  if (pEntry != (_ht *)0x0) {
    if (pEntry->count == 0) {
      pEntry->count = 1;
      pEntry->chain = pNew;
    }
    else {
      pHVar2 = pEntry->chain;
      pEntry->count = pEntry->count + 1;
      pEntry->chain = pNew;
      if (pHVar2 != (HashElem *)0x0) {
        pNew->next = pHVar2;
        pHVar1 = pHVar2->prev;
        ppHVar3 = &pHVar2->prev;
        pNew->prev = pHVar1;
        pHVar2 = (HashElem *)&pH->first;
        if (pHVar1 != (HashElem *)0x0) {
          pHVar2 = pHVar1;
        }
        pHVar2->next = pNew;
        goto LAB_0015b1ea;
      }
    }
  }
  pHVar2 = pH->first;
  pNew->next = pHVar2;
  if (pHVar2 != (HashElem *)0x0) {
    pHVar2->prev = pNew;
  }
  ppHVar3 = &pH->first;
  pNew->prev = (HashElem *)0x0;
LAB_0015b1ea:
  *ppHVar3 = pNew;
  return;
}

Assistant:

static void insertElement(
  Hash *pH,              /* The complete hash table */
  struct _ht *pEntry,    /* The entry into which pNew is inserted */
  HashElem *pNew         /* The element to be inserted */
){
  HashElem *pHead;       /* First element already in pEntry */
  if( pEntry ){
    pHead = pEntry->count ? pEntry->chain : 0;
    pEntry->count++;
    pEntry->chain = pNew;
  }else{
    pHead = 0;
  }
  if( pHead ){
    pNew->next = pHead;
    pNew->prev = pHead->prev;
    if( pHead->prev ){ pHead->prev->next = pNew; }
    else             { pH->first = pNew; }
    pHead->prev = pNew;
  }else{
    pNew->next = pH->first;
    if( pH->first ){ pH->first->prev = pNew; }
    pNew->prev = 0;
    pH->first = pNew;
  }
}